

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_rewriter.cpp
# Opt level: O1

unique_ptr<duckdb::SetTypesMatcher,_std::default_delete<duckdb::SetTypesMatcher>,_true>
duckdb::GetSmallIntegerTypesMatcher(void)

{
  pointer pLVar1;
  pointer pLVar2;
  pointer pLVar3;
  undefined8 *puVar4;
  unique_ptr<duckdb::SetTypesMatcher,_std::default_delete<duckdb::SetTypesMatcher>_> in_RDI;
  long lVar5;
  initializer_list<duckdb::LogicalType> __l;
  vector<duckdb::LogicalType,_true> types;
  allocator_type local_f9;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_f8;
  LogicalType local_d8 [4];
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  LogicalType local_30;
  
  LogicalType::LogicalType(local_d8,TINYINT);
  LogicalType::LogicalType(local_d8 + 1,SMALLINT);
  LogicalType::LogicalType(local_d8 + 2,INTEGER);
  LogicalType::LogicalType(local_d8 + 3,BIGINT);
  LogicalType::LogicalType(&local_78,UTINYINT);
  LogicalType::LogicalType(&local_60,USMALLINT);
  LogicalType::LogicalType(&local_48,UINTEGER);
  LogicalType::LogicalType(&local_30,UBIGINT);
  __l._M_len = 8;
  __l._M_array = local_d8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_f8,__l,&local_f9);
  lVar5 = 0xa8;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_d8[0].id_ + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  puVar4 = (undefined8 *)operator_new(0x20);
  pLVar3 = local_f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  pLVar2 = local_f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pLVar1 = local_f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *puVar4 = &PTR__SetTypesMatcher_019abb68;
  puVar4[1] = pLVar1;
  puVar4[2] = pLVar2;
  puVar4[3] = pLVar3;
  local_d8[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8[0].id_ = INVALID;
  local_d8[0].physical_type_ = ~INVALID;
  local_d8[0]._2_6_ = 0;
  local_d8[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  *(undefined8 **)
   in_RDI._M_t.
   super___uniq_ptr_impl<duckdb::SetTypesMatcher,_std::default_delete<duckdb::SetTypesMatcher>_>.
   _M_t.
   super__Tuple_impl<0UL,_duckdb::SetTypesMatcher_*,_std::default_delete<duckdb::SetTypesMatcher>_>.
   super__Head_base<0UL,_duckdb::SetTypesMatcher_*,_false>._M_head_impl = puVar4;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_d8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_f8);
  return (unique_ptr<duckdb::SetTypesMatcher,_std::default_delete<duckdb::SetTypesMatcher>_>)
         (__uniq_ptr_impl<duckdb::SetTypesMatcher,_std::default_delete<duckdb::SetTypesMatcher>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::SetTypesMatcher,_std::default_delete<duckdb::SetTypesMatcher>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SetTypesMatcher_*,_std::default_delete<duckdb::SetTypesMatcher>_>
         .super__Head_base<0UL,_duckdb::SetTypesMatcher_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<SetTypesMatcher> GetSmallIntegerTypesMatcher() {
	vector<LogicalType> types {LogicalTypeId::TINYINT,  LogicalTypeId::SMALLINT, LogicalTypeId::INTEGER,
	                           LogicalTypeId::BIGINT,   LogicalTypeId::UTINYINT, LogicalTypeId::USMALLINT,
	                           LogicalTypeId::UINTEGER, LogicalTypeId::UBIGINT};
	return make_uniq<SetTypesMatcher>(std::move(types));
}